

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

bool VerifyXrParent(XrObjectType handle1_type,uint64_t handle1,XrObjectType handle2_type,
                   uint64_t handle2,bool check_this)

{
  bool bVar1;
  uint64_t parent2_handle;
  uint64_t parent1_handle;
  XrObjectType parent2_type;
  XrObjectType parent1_type;
  XrObjectType local_38;
  undefined4 uStack_34;
  uint64_t local_30;
  XrObjectType local_28;
  XrObjectType local_24;
  
  if (handle2 != 0 && handle1 != 0) {
    if (check_this && handle1_type == handle2_type) {
      return handle1 == handle2;
    }
    if (handle2_type == XR_OBJECT_TYPE_INSTANCE || handle1_type != XR_OBJECT_TYPE_INSTANCE) {
      if (handle1_type == XR_OBJECT_TYPE_INSTANCE || handle2_type != XR_OBJECT_TYPE_INSTANCE) {
        bVar1 = GetXrParent(handle1_type,handle1,&local_24,&local_30);
        if ((bVar1) &&
           (bVar1 = GetXrParent(handle2_type,handle2,&local_28,(uint64_t *)&local_38), bVar1)) {
          if (local_24 == handle2_type) {
            return local_30 == handle2;
          }
          if (local_28 == handle1_type) {
            return CONCAT44(uStack_34,local_38) == handle1;
          }
          handle2 = CONCAT44(uStack_34,local_38);
          handle1 = local_30;
          local_38 = local_24;
          goto LAB_0015512f;
        }
      }
      else {
        bVar1 = GetXrParent(handle1_type,handle1,&local_38,&local_30);
        if (bVar1) {
          local_28 = XR_OBJECT_TYPE_INSTANCE;
          handle1 = local_30;
LAB_0015512f:
          bVar1 = VerifyXrParent(local_38,handle1,local_28,handle2,true);
          return bVar1;
        }
      }
    }
    else {
      bVar1 = GetXrParent(handle2_type,handle2,&local_38,&local_30);
      if (bVar1) {
        handle2 = local_30;
        local_28 = local_38;
        local_38 = XR_OBJECT_TYPE_INSTANCE;
        goto LAB_0015512f;
      }
    }
  }
  return false;
}

Assistant:

bool VerifyXrParent(XrObjectType handle1_type, const uint64_t handle1,
                    XrObjectType handle2_type, const uint64_t handle2,
                    bool check_this) {
    if (IsIntegerNullHandle(handle1) || IsIntegerNullHandle(handle2)) {
        return false;
    } else if (check_this && handle1_type == handle2_type) {
        return (handle1 == handle2);
    }
    if (handle1_type == XR_OBJECT_TYPE_INSTANCE && handle2_type != XR_OBJECT_TYPE_INSTANCE) {
        XrObjectType parent_type;
        uint64_t parent_handle;
        if (!GetXrParent(handle2_type, handle2, parent_type, parent_handle)) {
            return false;
        }
        return VerifyXrParent(handle1_type, handle1, parent_type, parent_handle, true);
    } else if (handle2_type == XR_OBJECT_TYPE_INSTANCE && handle1_type != XR_OBJECT_TYPE_INSTANCE) {
        XrObjectType parent_type;
        uint64_t parent_handle;
        if (!GetXrParent(handle1_type, handle1, parent_type, parent_handle)) {
            return false;
        }
        return VerifyXrParent(parent_type, parent_handle, handle2_type, handle2, true);
    } else {
        XrObjectType parent1_type;
        uint64_t parent1_handle;
                XrObjectType parent2_type;
        uint64_t parent2_handle;
        if (!GetXrParent(handle1_type, handle1, parent1_type, parent1_handle)) {
            return false;
        }
        if (!GetXrParent(handle2_type, handle2, parent2_type, parent2_handle)) {
            return false;
        }
        if (parent1_type == handle2_type) {
            return (parent1_handle == handle2);
        } else if (handle1_type == parent2_type) {
            return (handle1 == parent2_handle);
        } else {
            return VerifyXrParent(parent1_type, parent1_handle, parent2_type, parent2_handle, true);
        }
    }
    return false;
}